

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConversion.hxx
# Opt level: O3

WavelengthUnit __thiscall
FileParse::enumFromStringCaseInsensitive<BSDFData::WavelengthUnit,3ul>
          (FileParse *this,string_view name,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *values,WavelengthUnit defaultValue)

{
  long lVar1;
  long *plVar2;
  size_t sVar3;
  int iVar4;
  WavelengthUnit WVar5;
  size_t i;
  long lVar6;
  size_t sVar7;
  long *plVar8;
  bool bVar9;
  string lowerName;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  WVar5 = (WavelengthUnit)values;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,name._M_len,this + name._M_len);
  sVar3 = local_68;
  plVar2 = local_70;
  if (local_68 != 0) {
    sVar7 = 0;
    do {
      iVar4 = tolower((uint)*(byte *)((long)plVar2 + sVar7));
      *(char *)((long)plVar2 + sVar7) = (char)iVar4;
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  lVar6 = 0;
  do {
    lVar1 = *(long *)(name._M_str + lVar6 * 0x20);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,lVar1,*(long *)(name._M_str + lVar6 * 0x20 + 8) + lVar1);
    sVar3 = local_48;
    plVar2 = local_50;
    if (local_48 == 0) {
      if (local_68 != 0) goto LAB_0019533c;
      bVar9 = true;
      plVar8 = local_50;
    }
    else {
      sVar7 = 0;
      do {
        iVar4 = tolower((uint)*(byte *)((long)plVar2 + sVar7));
        plVar8 = local_50;
        *(char *)((long)plVar2 + sVar7) = (char)iVar4;
        sVar7 = sVar7 + 1;
      } while (sVar3 != sVar7);
      if (local_48 == local_68) {
        if (local_48 == 0) {
          bVar9 = true;
        }
        else {
          iVar4 = bcmp(local_50,local_70,local_48);
          bVar9 = iVar4 == 0;
        }
      }
      else {
LAB_0019533c:
        bVar9 = false;
        plVar8 = local_50;
      }
    }
    if (plVar8 != local_40) {
      operator_delete(plVar8,local_40[0] + 1);
    }
    if (bVar9) {
      WVar5 = (WavelengthUnit)lVar6;
      goto LAB_0019537e;
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 3) {
LAB_0019537e:
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      return WVar5;
    }
  } while( true );
}

Assistant:

EnumType enumFromStringCaseInsensitive(std::string_view name,
                                           const std::array<std::string, N> & values,
                                           EnumType defaultValue)
    {
        std::string lowerName = toLower(name);
        for(std::size_t i = 0; i < values.size(); ++i)
        {
            if(toLower(values[i]) == lowerName)
            {
                return static_cast<EnumType>(i);
            }
        }

        return defaultValue;
    }